

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * __thiscall
testing::internal::StreamingListener::UrlEncode_abi_cxx11_
          (string *__return_storage_ptr__,StreamingListener *this,char *str)

{
  void *pvVar1;
  ulong uVar2;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  void *local_40;
  long local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  strlen((char *)this);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  do {
    uVar2 = (ulong)*(byte *)&(this->super_EmptyTestEventListener).super_TestEventListener.
                             _vptr_TestEventListener;
    if (uVar2 < 0x3e) {
      if ((0x2000006000000400U >> (uVar2 & 0x3f) & 1) == 0) {
        if (uVar2 == 0) {
          return __return_storage_ptr__;
        }
        goto LAB_00112bcc;
      }
      String::Format((char *)&local_40,"%%%02x");
      pvVar1 = local_40;
      local_60[0] = local_50;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_60,local_40,local_38 + (long)local_40);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_60[0]);
      if (local_60[0] != local_50) {
        operator_delete(local_60[0]);
      }
      if (pvVar1 != (void *)0x0) {
        operator_delete__(pvVar1);
      }
    }
    else {
LAB_00112bcc:
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    this = (StreamingListener *)
           ((long)&(this->super_EmptyTestEventListener).super_TestEventListener.
                   _vptr_TestEventListener + 1);
  } while( true );
}

Assistant:

string StreamingListener::UrlEncode(const char* str) {
  string result;
  result.reserve(strlen(str) + 1);
  for (char ch = *str; ch != '\0'; ch = *++str) {
    switch (ch) {
      case '%':
      case '=':
      case '&':
      case '\n':
        result.append(String::Format("%%%02x", static_cast<unsigned char>(ch)));
        break;
      default:
        result.push_back(ch);
        break;
    }
  }
  return result;
}